

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::ValidateContent
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this)

{
  Uint32 UVar1;
  undefined *puVar2;
  bool bVar3;
  Uint32 UVar4;
  RESOURCE_STATE RVar5;
  reference this_00;
  BottomLevelASVkImpl *pBVar6;
  BottomLevelASDesc *pBVar7;
  undefined8 uVar8;
  char (*in_R8) [116];
  char (*in_stack_fffffffffffffef8) [61];
  char **in_stack_ffffffffffffff00;
  Char *local_c8;
  Char *local_c0;
  undefined1 local_b8 [8];
  string _msg_2;
  undefined1 local_90 [8];
  string _msg_1;
  InstanceDesc *Inst;
  value_type *NameAndInst;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
  *__range2;
  undefined1 local_38 [8];
  string _msg;
  bool result;
  TopLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  _msg.field_2._M_local_buf[0xf] = '\x01';
  bVar3 = std::
          unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
          ::empty(&this->m_Instances);
  if (bVar3) {
    FormatString<char[18],char_const*,char[116]>
              ((string *)local_38,(Diligent *)"TLAS with name (\'",
               (char (*) [18])
               &(this->
                super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                ).m_Desc,
               (char **)
               "\') doesn\'t have instances, use IDeviceContext::BuildTLAS() or IDeviceContext::CopyTLAS() to initialize TLAS content"
               ,in_R8);
    puVar2 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      (*(code *)puVar2)(2,uVar8,0);
    }
    std::__cxx11::string::~string((string *)local_38);
    _msg.field_2._M_local_buf[0xf] = '\0';
  }
  __end0 = std::
           unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
           ::begin(&this->m_Instances);
  NameAndInst = (value_type *)
                std::
                unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
                ::end(&this->m_Instances);
  while (bVar3 = std::__detail::operator!=
                           (&__end0.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                            ,(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                              *)&NameAndInst), bVar3) {
    this_00 = std::__detail::
              _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
              ::operator*(&__end0);
    _msg_1.field_2._8_8_ = &this_00->second;
    UVar1 = (this_00->second).dvpVersion;
    pBVar6 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->(&(this_00->second).pBLAS);
    UVar4 = BottomLevelASBase<Diligent::EngineVkImplTraits>::DvpGetVersion
                      (&pBVar6->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
    if (UVar1 != UVar4) {
      _msg_2.field_2._8_8_ = HashMapStringKey::GetStr(&this_00->first);
      pBVar6 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->
                         ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)(_msg_1.field_2._8_8_ + 8)
                         );
      pBVar7 = DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                          *)pBVar6);
      FormatString<char[21],char_const*,char[28],char_const*,char[59]>
                ((string *)local_90,(Diligent *)"Instance with name \'",
                 (char (*) [21])((long)&_msg_2.field_2 + 8),(char **)"\' contains BLAS with name \'"
                 ,(char (*) [28])pBVar7,
                 (char **)"\' that was changed after TLAS build, you must rebuild TLAS",
                 (char (*) [59])in_stack_fffffffffffffef8);
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_90);
      _msg.field_2._M_local_buf[0xf] = '\0';
    }
    pBVar6 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->
                       ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)(_msg_1.field_2._8_8_ + 8));
    bVar3 = BottomLevelASBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&pBVar6->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
    if (bVar3) {
      pBVar6 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->
                         ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)(_msg_1.field_2._8_8_ + 8)
                         );
      RVar5 = BottomLevelASBase<Diligent::EngineVkImplTraits>::GetState
                        (&pBVar6->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
      if (RVar5 != RESOURCE_STATE_BUILD_AS_READ) {
        local_c0 = HashMapStringKey::GetStr(&this_00->first);
        pBVar6 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)
                            (_msg_1.field_2._8_8_ + 8));
        pBVar7 = DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                            *)pBVar6);
        pBVar6 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)
                            (_msg_1.field_2._8_8_ + 8));
        RVar5 = BottomLevelASBase<Diligent::EngineVkImplTraits>::GetState
                          (&pBVar6->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
        local_c8 = GetResourceStateFlagString(RVar5);
        in_stack_fffffffffffffef8 = (char (*) [61])&local_c8;
        FormatString<char[21],char_const*,char[28],char_const*,char[61],char_const*>
                  ((string *)local_b8,(Diligent *)"Instance with name \'",(char (*) [21])&local_c0,
                   (char **)"\' contains BLAS with name \'",(char (*) [28])pBVar7,
                   (char **)"\' that must be in BUILD_AS_READ state, but current state is ",
                   in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
        puVar2 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar8 = std::__cxx11::string::c_str();
          (*(code *)puVar2)(2,uVar8,0);
        }
        std::__cxx11::string::~string((string *)local_b8);
        _msg.field_2._M_local_buf[0xf] = '\0';
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
    ::operator++(&__end0);
  }
  return (bool)(_msg.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool ValidateContent() const
    {
        bool result = true;

        if (this->m_Instances.empty())
        {
            LOG_ERROR_MESSAGE("TLAS with name ('", this->m_Desc.Name, "') doesn't have instances, use IDeviceContext::BuildTLAS() or IDeviceContext::CopyTLAS() to initialize TLAS content");
            result = false;
        }

        // Validate instances
        for (const auto& NameAndInst : this->m_Instances)
        {
            const InstanceDesc& Inst = NameAndInst.second;

            if (Inst.dvpVersion != Inst.pBLAS->DvpGetVersion())
            {
                LOG_ERROR_MESSAGE("Instance with name '", NameAndInst.first.GetStr(), "' contains BLAS with name '", Inst.pBLAS->GetDesc().Name,
                                  "' that was changed after TLAS build, you must rebuild TLAS");
                result = false;
            }

            if (Inst.pBLAS->IsInKnownState() && Inst.pBLAS->GetState() != RESOURCE_STATE_BUILD_AS_READ)
            {
                LOG_ERROR_MESSAGE("Instance with name '", NameAndInst.first.GetStr(), "' contains BLAS with name '", Inst.pBLAS->GetDesc().Name,
                                  "' that must be in BUILD_AS_READ state, but current state is ",
                                  GetResourceStateFlagString(Inst.pBLAS->GetState()));
                result = false;
            }
        }
        return result;
    }